

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O3

void Abc_NtkMultiSetBounds(Abc_Ntk_t *pNtk,int nThresh,int nFaninMax)

{
  uint *puVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *vCone;
  void **__ptr;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  
  vCone = (Vec_Ptr_t *)malloc(0x10);
  vCone->nCap = 10;
  vCone->nSize = 0;
  __ptr = (void **)malloc(0x50);
  vCone->pArray = __ptr;
  pVVar5 = pNtk->vObjs;
  iVar4 = pVVar5->nSize;
  if (0 < (long)iVar4) {
    lVar7 = 0;
    do {
      if ((pVVar5->pArray[lVar7] != (void *)0x0) &&
         ((*(byte *)((long)pVVar5->pArray[lVar7] + 0x14) & 0x10) != 0)) {
        __assert_fail("pNode->fMarkA == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMulti.c"
                      ,0x18c,"void Abc_NtkMultiSetBounds(Abc_Ntk_t *, int, int)");
      }
      lVar7 = lVar7 + 1;
    } while (iVar4 != lVar7);
    if (0 < iVar4) {
      lVar7 = 0;
      do {
        pAVar2 = (Abc_Obj_t *)pVVar5->pArray[lVar7];
        if (((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) &&
           (iVar4 = (pAVar2->vFanouts).nSize, iVar3 = Abc_NodeMffcSize(pAVar2),
           nThresh < (iVar4 + -1) * iVar3)) {
          pAVar2->field_0x14 = pAVar2->field_0x14 | 0x10;
        }
        lVar7 = lVar7 + 1;
        pVVar5 = pNtk->vObjs;
      } while (lVar7 < pVVar5->nSize);
    }
  }
  pVVar6 = pNtk->vCos;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*pVVar6->pArray[lVar7] + 0x20) + 8) +
                                 (long)**(int **)((long)pVVar6->pArray[lVar7] + 0x20) * 8) + 0x14);
      *puVar1 = *puVar1 | 0x10;
      lVar7 = lVar7 + 1;
      pVVar6 = pNtk->vCos;
    } while (lVar7 < pVVar6->nSize);
    pVVar5 = pNtk->vObjs;
  }
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar5->pArray[lVar7];
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0x1f) == 0x17)) {
        do {
          vCone->nSize = 0;
          iVar4 = Abc_NtkMultiLimit_rec(pAVar2,vCone,nFaninMax,1,1);
        } while (iVar4 != 0);
        if (nFaninMax < vCone->nSize) {
          __assert_fail("vCone->nSize <= nFaninMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMulti.c"
                        ,0x1a9,"void Abc_NtkMultiSetBounds(Abc_Ntk_t *, int, int)");
        }
        pVVar5 = pNtk->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar5->nSize);
    __ptr = vCone->pArray;
  }
  if (__ptr != (void **)0x0) {
    free(__ptr);
  }
  free(vCone);
  return;
}

Assistant:

void Abc_NtkMultiSetBounds( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax )
{
    Vec_Ptr_t * vCone = Vec_PtrAlloc(10);
    Abc_Obj_t * pNode;
    int i, nFanouts, nConeSize;

    // make sure the mark is not set
    Abc_NtkForEachObj( pNtk, pNode, i )
        assert( pNode->fMarkA == 0 );

    // mark the nodes where expansion stops using pNode->fMarkA
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // skip PI/PO nodes
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        // mark the nodes with multiple fanouts
        nFanouts = Abc_ObjFanoutNum(pNode);
        nConeSize = Abc_NodeMffcSize(pNode);
        if ( (nFanouts - 1) * nConeSize > nThresh )
            pNode->fMarkA = 1;
    }

    // mark the PO drivers
    Abc_NtkForEachCo( pNtk, pNode, i )
        Abc_ObjFanin0(pNode)->fMarkA = 1;

    // make sure the fanin limit is met
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // skip PI/PO nodes
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        if ( pNode->fMarkA == 0 )
            continue;
        // continue cutting branches until it meets the fanin limit
        while ( Abc_NtkMultiLimit(pNode, vCone, nFaninMax) );
        assert( vCone->nSize <= nFaninMax );  
    }
    Vec_PtrFree(vCone);
/*
    // make sure the fanin limit is met
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // skip PI/PO nodes
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        if ( pNode->fMarkA == 0 )
            continue;
        Abc_NtkMultiCone( pNode, vCone );
        assert( vCone->nSize <= nFaninMax );    
    }
*/
}